

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O0

void __thiscall Deck::getCardFrom(Deck *this,Deck *from)

{
  bool bVar1;
  reference ppCVar2;
  _List_iterator<Card_*> local_28;
  Card *local_20;
  Card *card;
  Deck *from_local;
  Deck *this_local;
  
  card = (Card *)from;
  from_local = this;
  bVar1 = isEmpty(from);
  if (!bVar1) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<Card_*,_std::allocator<Card_*>_>::begin(&from->deck);
    ppCVar2 = std::_List_iterator<Card_*>::operator*(&local_28);
    local_20 = popCard(from,*ppCVar2);
    pushCard(this,local_20);
  }
  return;
}

Assistant:

void Deck::getCardFrom(Deck from)                   //pops a card from another deck and pushes it into this deck
{
    if (from.isEmpty())
        return;

    Card *card = from.popCard(*from.deck.begin());

    this->pushCard(card);

    card = nullptr;
    delete card;
}